

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.h
# Opt level: O0

void __thiscall json::string::~string(string *this)

{
  string *this_local;
  
  (this->super_value)._vptr_value = (_func_int **)&PTR__string_0019eb98;
  std::__cxx11::string::~string((string *)&this->_data);
  json::value::~value(&this->super_value);
  return;
}

Assistant:

~string () {}